

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_25891e7::Impl::send(Impl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  atomic<unsigned_int> *paVar1;
  function<void_(const_void_*,_const_dap::Error_*)> *__x;
  bool bVar2;
  ulong uVar3;
  void **__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>,_false,_false>,_bool>
  pVar4;
  __atomic_base<unsigned_int> local_88;
  int seq;
  Serializer s;
  undefined1 local_68 [8];
  undefined1 auStack_60 [8];
  undefined1 local_58 [32];
  void *request_local;
  TypeInfo *requestTypeInfo_local;
  
  requestTypeInfo_local = (TypeInfo *)CONCAT44(in_register_00000034,__fd);
  __x = (function<void_(const_void_*,_const_dap::Error_*)> *)CONCAT44(in_register_00000084,__flags);
  LOCK();
  paVar1 = &this->nextSeq;
  local_88._M_i = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  seq = local_88._M_i;
  request_local = (void *)__n;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&s,&(this->handlers).responseMutex);
  local_68 = (undefined1  [8])__buf;
  std::function<void_(const_void_*,_const_dap::Error_*)>::function
            ((function<void_(const_void_*,_const_dap::Error_*)> *)auStack_60,__x);
  pVar4 = std::
          _Hashtable<long,std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>,std::allocator<std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<int&,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>
                    ((_Hashtable<long,std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>,std::allocator<std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&(this->handlers).responseMap,&local_88,local_68);
  std::_Function_base::~_Function_base((_Function_base *)auStack_60);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    EventHandlers::errorfLocked
              (&this->handlers,"Response handler for sequence %d already registered",
               (ulong)local_88._M_i);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&s);
  dap::json::JsonCppSerializer::JsonCppSerializer(&s);
  local_58._0_8_ = 0;
  local_58._8_8_ = (_Manager_type)0x0;
  local_68 = (undefined1  [8])0x0;
  auStack_60 = (undefined1  [8])0x0;
  local_68 = (undefined1  [8])operator_new(0x18);
  *(int **)local_68 = &seq;
  *(TypeInfo ***)((long)local_68 + 8) = &requestTypeInfo_local;
  __n_00 = &request_local;
  *(void ***)((long)local_68 + 0x10) = __n_00;
  local_58._8_8_ =
       std::
       _Function_handler<bool_(dap::FieldSerializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/src/session.cpp:113:19)>
       ::_M_invoke;
  local_58._0_8_ =
       std::
       _Function_handler<bool_(dap::FieldSerializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/src/session.cpp:113:19)>
       ::_M_manager;
  bVar2 = dap::json::JsonCppSerializer::object
                    (&s,(function<bool_(dap::FieldSerializer_*)> *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  if (bVar2) {
    dap::json::JsonCppSerializer::dump_abi_cxx11_((string *)local_68,&s);
    uVar3 = send(this,(int)local_68,__buf_00,(size_t)__n_00,__flags);
    uVar3 = uVar3 & 0xffffffff;
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    uVar3 = 0;
  }
  dap::json::JsonCppSerializer::~JsonCppSerializer(&s);
  return uVar3;
}

Assistant:

bool send(const dap::TypeInfo* requestTypeInfo,
            const dap::TypeInfo* responseTypeInfo,
            const void* request,
            const GenericResponseHandler& responseHandler) override {
    int seq = nextSeq++;

    handlers.put(seq, responseTypeInfo, responseHandler);

    dap::json::Serializer s;
    if (!s.object([&](dap::FieldSerializer* fs) {
          return fs->field("seq", dap::integer(seq)) &&
                 fs->field("type", "request") &&
                 fs->field("command", requestTypeInfo->name()) &&
                 fs->field("arguments", [&](dap::Serializer* s) {
                   return requestTypeInfo->serialize(s, request);
                 });
        })) {
      return false;
    }
    return send(s.dump());
  }